

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,uint *key,InstrByteCodeRegisterUses *value)

{
  undefined6 uVar1;
  bool bVar2;
  InstrByteCodeRegisterUses *pIVar3;
  uint local_34;
  int local_30;
  uint targetBucket;
  int last;
  int i;
  InstrByteCodeRegisterUses *value_local;
  uint *key_local;
  BaseDictionary<unsigned_int,_Func::InstrByteCodeRegisterUses,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  _last = value;
  value_local = (InstrByteCodeRegisterUses *)key;
  key_local = (uint *)this;
  bVar2 = FindEntryWithKey<unsigned_int>(this,key,(int *)&targetBucket,&local_30,&local_34);
  if (bVar2) {
    pIVar3 = anon_unknown_4::
             ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
             ::Value((ValueEntry<Func::InstrByteCodeRegisterUses,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Func::InstrByteCodeRegisterUses>_>
                      *)(this->entries + (int)targetBucket));
    uVar1 = *(undefined6 *)&pIVar3->field_0x2;
    _last->capturingOpCode = pIVar3->capturingOpCode;
    *(undefined6 *)&_last->field_0x2 = uVar1;
    _last->bv = pIVar3->bv;
    RemoveAt(this,targetBucket,local_30,local_34);
  }
  return bVar2;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }